

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

uint32_t raplcap_get_num_packages(raplcap *rc)

{
  int iVar1;
  raplcap *prVar2;
  uint32_t uVar3;
  raplcap_msr_sys_ctx *ctx;
  uint32_t n_pkg;
  uint32_t n_die;
  uint32_t local_10;
  uint32_t local_c;
  
  prVar2 = &rc_default;
  if (rc != (raplcap *)0x0) {
    prVar2 = rc;
  }
  if (prVar2->state == (void *)0x0) {
    ctx = (raplcap_msr_sys_ctx *)0x0;
  }
  else {
    ctx = *(raplcap_msr_sys_ctx **)((long)prVar2->state + 0x38);
  }
  iVar1 = msr_sys_get_num_pkg_die(ctx,&local_10,&local_c);
  uVar3 = 0;
  if (iVar1 == 0) {
    uVar3 = local_10;
  }
  return uVar3;
}

Assistant:

uint32_t raplcap_get_num_packages(const raplcap* rc) {
  const raplcap_msr* state;
  const raplcap_msr_sys_ctx* sys;
  uint32_t n_pkg;
  uint32_t n_die;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    sys = state->sys;
  } else {
    sys = NULL;
  }
  return msr_sys_get_num_pkg_die(sys, &n_pkg, &n_die) ? 0 : n_pkg;
}